

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O2

bool qLocalTime(time_t utc,tm *local)

{
  tm *ptVar1;
  long in_FS_OFFSET;
  time_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = utc;
  QBasicMutex::lock(&environmentMutex);
  tzset();
  ptVar1 = localtime_r(&local_28,(tm *)local);
  QBasicMutex::unlock(&environmentMutex);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return ptVar1 != (tm *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool qLocalTime(time_t utc, struct tm *local)
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    // The doc of localtime_s() says that it corrects for the same things
    // _tzset() sets the globals for, but QTBUG-109974 reveals a need for an
    // explicit call, all the same.
    _tzset();
    return !localtime_s(local, &utc);
#elif QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS)
    // Use the reentrant version of localtime() where available, as it is
    // thread-safe and doesn't use a shared static data area.
    // As localtime_r() is not specified to work as if it called tzset(),
    // make an explicit call.
    tzset();
    if (tm *res = localtime_r(&utc, local)) {
        Q_ASSERT(res == local);
        Q_UNUSED(res);
        return true;
    }
    return false;
#else
    // POSIX mandates that localtime() behaves as if it called tzset().
    // Returns shared static data which may be overwritten at any time (albeit
    // our lock probably keeps it safe). So copy the result promptly:
    if (tm *res = localtime(&utc)) {
        *local = *res;
        return true;
    }
    return false;
#endif
}